

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O2

void Map_MappingSetRefs_rec(Map_Man_t *pMan,Map_Node_t *pNode)

{
  int iVar1;
  ulong uVar2;
  Map_Cut_t *pMVar3;
  uint uVar4;
  long lVar5;
  Map_Node_t *p;
  
  while( true ) {
    uVar4 = (uint)pNode;
    p = (Map_Node_t *)((ulong)pNode & 0xfffffffffffffffe);
    uVar2 = (ulong)(~uVar4 & 1);
    p->nRefAct[2] = p->nRefAct[2] + 1;
    iVar1 = p->nRefAct[uVar2];
    p->nRefAct[uVar2] = iVar1 + 1;
    if (iVar1 != 0) {
      return;
    }
    iVar1 = Map_NodeIsVar(p);
    if (iVar1 != 0) break;
    iVar1 = Map_NodeIsBuf(p);
    if (iVar1 == 0) {
      iVar1 = Map_NodeIsAnd(pNode);
      if (iVar1 != 0) {
        pMVar3 = p->pCutBest[uVar2];
        if (pMVar3 == (Map_Cut_t *)0x0) {
          uVar2 = (ulong)(uVar4 & 1);
          pMVar3 = p->pCutBest[uVar2];
        }
        uVar4 = pMVar3->M[uVar2].uPhaseBest;
        for (lVar5 = 0; lVar5 < pMVar3->nLeaves; lVar5 = lVar5 + 1) {
          Map_MappingSetRefs_rec
                    (pMan,(Map_Node_t *)
                          ((ulong)((uVar4 >> ((uint)lVar5 & 0x1f) & 1) != 0) ^
                          (ulong)pMVar3->ppLeaves[lVar5]));
        }
        return;
      }
      __assert_fail("Map_NodeIsAnd(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperRefs.c"
                    ,0x1a9,"void Map_MappingSetRefs_rec(Map_Man_t *, Map_Node_t *)");
    }
    pNode = (Map_Node_t *)((ulong)(uVar4 & 1) ^ (ulong)p->p1);
  }
  return;
}

Assistant:

void Map_MappingSetRefs_rec( Map_Man_t * pMan, Map_Node_t * pNode )
{
    Map_Cut_t * pCut;
    Map_Node_t * pNodeR;
    unsigned uPhase;
    int i, fPhase, fInvPin;
    // get the regular node and its phase
    pNodeR = Map_Regular(pNode);
    fPhase = !Map_IsComplement(pNode);
    pNodeR->nRefAct[2]++;
    // quit if the node was already visited in this phase
    if ( pNodeR->nRefAct[fPhase]++ )
        return;
    // quit if this is a PI node
    if ( Map_NodeIsVar(pNodeR) )
        return;
    // propagate through buffer
    if ( Map_NodeIsBuf(pNodeR) )
    {
        Map_MappingSetRefs_rec( pMan, Map_NotCond(pNodeR->p1, Map_IsComplement(pNode)) );
        return;
    }
    assert( Map_NodeIsAnd(pNode) );
    // get the cut implementing this or opposite polarity
    pCut = pNodeR->pCutBest[fPhase];
    if ( pCut == NULL )
    {
        fPhase = !fPhase;
        pCut   = pNodeR->pCutBest[fPhase];
    }
    // visit the transitive fanin
    uPhase = pCut->M[fPhase].uPhaseBest;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        fInvPin = ((uPhase & (1 << i)) > 0);
        Map_MappingSetRefs_rec( pMan, Map_NotCond(pCut->ppLeaves[i], fInvPin) );
    }
}